

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O0

void test_abs<unsigned_long>(uint length)

{
  unsigned_long *__p;
  element_type *peVar1;
  int local_338;
  int i_1;
  int local_324;
  int i;
  unsigned_long *v;
  shared_ptr<unsigned_long> pv;
  uint length_local;
  
  pv.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = length;
  __p = sse::common::malloc<unsigned_long>(length);
  std::shared_ptr<unsigned_long>::shared_ptr<unsigned_long,void(*)(unsigned_long*),void>
            ((shared_ptr<unsigned_long> *)&v,__p,sse::common::free<unsigned_long>);
  peVar1 = std::__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2> *)&v);
  for (local_324 = 0;
      local_324 <
      (int)(uint)pv.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_324 = local_324 + 1) {
    peVar1[local_324] = (long)-local_324;
  }
  pv.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       (uint)pv.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  for (local_338 = 0;
      local_338 <
      (int)(uint)pv.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_338 = local_338 + 1) {
  }
  std::shared_ptr<unsigned_long>::~shared_ptr((shared_ptr<unsigned_long> *)&v);
  return;
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}